

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

int lys_ext_instance_presence(lys_ext *def,lys_ext_instance **ext,uint8_t ext_size)

{
  lys_ext *plVar1;
  char *s1;
  int iVar2;
  lys_module *plVar3;
  ulong uVar4;
  
  if ((def == (lys_ext *)0x0) || (ext == (lys_ext_instance **)0x0 && ext_size != '\0')) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_ext_instance_presence")
    ;
  }
  else {
    if (ext_size == '\0') {
      return -1;
    }
    uVar4 = 0;
    do {
      plVar1 = ext[uVar4]->def;
      if (ext[uVar4]->module->ctx == def->module->ctx) {
        if (plVar1 == def) {
LAB_0017056c:
          return (int)uVar4;
        }
      }
      else {
        iVar2 = ly_strequal_(plVar1->name,def->name);
        if (iVar2 != 0) {
          plVar3 = lys_main_module(ext[uVar4]->def->module);
          s1 = plVar3->name;
          plVar3 = lys_main_module(def->module);
          iVar2 = ly_strequal_(s1,plVar3->name);
          if (iVar2 != 0) goto LAB_0017056c;
        }
      }
      uVar4 = uVar4 + 1;
    } while (ext_size != uVar4);
  }
  return -1;
}

Assistant:

API int
lys_ext_instance_presence(struct lys_ext *def, struct lys_ext_instance **ext, uint8_t ext_size)
{
    uint8_t index;

    if (!def || (ext_size && !ext)) {
        LOGARG;
        return -1;
    }

    /* search for the extension instance */
    for (index = 0; index < ext_size; index++) {
        if (ext[index]->module->ctx == def->module->ctx) {
            /* from the same context */
            if (ext[index]->def == def) {
                return index;
            }
        } else {
            /* from different contexts */
            if (ly_strequal0(ext[index]->def->name, def->name)
                    && ly_strequal0(lys_main_module(ext[index]->def->module)->name, lys_main_module(def->module)->name)) {
                return index;
            }
        }
    }

    /* not found */
    return -1;
}